

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xvector.c
# Opt level: O0

void * values_destroy(xvec_t *xv,size_t pos,int count)

{
  uchar *local_28;
  uchar *v;
  int count_local;
  size_t pos_local;
  xvec_t *xv_local;
  
  local_28 = xv->data + xv->val_size * pos;
  v._4_4_ = count;
  while( true ) {
    if (v._4_4_ < 1) break;
    (*xv->destroy_cb)(local_28);
    local_28 = local_28 + xv->val_size;
    v._4_4_ = v._4_4_ + -1;
  }
  return local_28;
}

Assistant:

static void* values_destroy(xvec_t* xv, size_t pos, int count)
{
    unsigned char* v = xvec_at(xv, pos);

    while (count-- > 0)
    {
        xv->destroy_cb((void*)v);
        v += xv->val_size;
    }

    return (void*)v;
}